

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O1

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DuckTableEntry::AddForeignKeyConstraint
          (DuckTableEntry *this,optional_ptr<duckdb::ClientContext,_true> context,
          AlterForeignKeyInfo *info)

{
  size_type *psVar1;
  __node_base *__ht;
  bool bVar2;
  SchemaCatalogEntry *pSVar3;
  pointer puVar4;
  Catalog *catalog;
  _Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false> _Var5;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> _Var6;
  undefined8 uVar7;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> _Var8;
  CreateTableInfo *this_00;
  pointer pCVar9;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  reference this_02;
  pointer pCVar10;
  Binder *info_00;
  type info_01;
  DuckTableEntry *this_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RCX;
  pointer *__ptr;
  size_type __n;
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
  bound_create_info;
  templated_unique_single_t create_info;
  shared_ptr<duckdb::Binder,_true> binder;
  ForeignKeyInfo fk_info;
  _Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false> local_108;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> local_100;
  undefined1 local_f8 [32];
  undefined1 local_d8 [24];
  optional_ptr<duckdb::ClientContext,_true> local_c0;
  undefined1 local_b8 [8];
  __node_base _Stack_b0;
  undefined1 local_a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> local_70;
  Val VStack_58;
  pointer pPStack_48;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  pSVar3 = *(SchemaCatalogEntry **)&((context.ptr)->config).query_verification_enabled;
  local_c0.ptr = (ClientContext *)info;
  local_40._M_head_impl = (CatalogEntry *)this;
  this_00 = (CreateTableInfo *)operator_new(0x1d8);
  local_b8 = (undefined1  [8])local_a8;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_b8,*(long *)&(context.ptr)->interrupted,
             (long)&((((context.ptr)->registered_state).
                      super_unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
                      .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl)
                    ->lock).super___mutex_base._M_mutex + *(long *)&(context.ptr)->interrupted);
  CreateTableInfo::CreateTableInfo(this_00,pSVar3,(string *)local_b8);
  local_100._M_head_impl = this_00;
  if (local_b8 != (undefined1  [8])local_a8) {
    operator_delete((void *)local_b8);
  }
  bVar2 = *(bool *)((long)&((context.ptr)->config).home_directory._M_string_length + 1);
  pCVar9 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_100);
  (pCVar9->super_CreateInfo).temporary = bVar2;
  pCVar9 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_100);
  Value::operator=(&(pCVar9->super_CreateInfo).comment,
                   (Value *)((long)&((context.ptr)->config).home_directory.field_2 + 8));
  pCVar9 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_100);
  __ht = &((context.ptr)->config).profiler_settings._M_h._M_before_begin;
  this_01 = &(pCVar9->super_CreateInfo).tags;
  if ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)__ht != this_01) {
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this_01,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)__ht);
  }
  ColumnList::Copy((ColumnList *)local_b8,
                   (ColumnList *)&((context.ptr)->config).asof_loop_join_threshold);
  pCVar9 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_100);
  local_f8._0_8_ =
       (pCVar9->columns).columns.
       super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
       super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_f8._8_8_ =
       (pCVar9->columns).columns.
       super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
       super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_f8._16_8_ =
       (pCVar9->columns).columns.
       super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
       super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pCVar9->columns).columns.
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_b8;
  (pCVar9->columns).columns.
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)_Stack_b0._M_nxt;
  (pCVar9->columns).columns.
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_a8;
  local_b8 = (undefined1  [8])0x0;
  _Stack_b0._M_nxt = (_Hash_node_base *)0x0;
  local_a8 = (undefined1  [8])0x0;
  ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::~vector
            ((vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> *)local_f8
            );
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&(pCVar9->columns).name_map,local_a8 + 8);
  puVar4 = (pCVar9->columns).physical_columns.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  (pCVar9->columns).physical_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = &(local_70.
               super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
               _M_impl.super__Vector_impl_data._M_finish)->index;
  (pCVar9->columns).physical_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = &(local_70.
                super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage)->index;
  (pCVar9->columns).physical_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)VStack_58.bigint;
  local_70.super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  VStack_58.bigint = 0;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4);
  }
  (pCVar9->columns).allow_duplicate_names = (bool)VStack_58.hugeint.upper._0_1_;
  if (local_70.super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete(local_70.
                    super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_38._M_pi = in_RCX;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_a8 + 8));
  ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::~vector
            ((vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> *)local_b8
            );
  if (((context.ptr)->config).set_variables._M_h._M_single_bucket !=
      (__node_base_ptr)((context.ptr)->config).set_variables._M_h._M_rehash_policy._M_next_resize) {
    __n = 0;
    do {
      pCVar9 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
               ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                             *)&local_100);
      this_02 = vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                              *)&((context.ptr)->config).set_variables._M_h._M_rehash_policy.
                                 _M_next_resize,__n);
      pCVar10 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                operator->(this_02);
      (*pCVar10->_vptr_Constraint[3])
                ((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
                 local_b8,pCVar10);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
                  *)&pCVar9->constraints,
                 (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
                 local_b8);
      if (local_b8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_b8 + 8))();
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)((long)((context.ptr)->config).set_variables._M_h._M_single_bucket
                                 - ((context.ptr)->config).set_variables._M_h._M_rehash_policy.
                                   _M_next_resize) >> 3));
  }
  _Stack_b0._M_nxt = (_Hash_node_base *)(local_a8 + 8);
  local_a8 = (undefined1  [8])0x0;
  local_a0._M_local_buf[0] = '\0';
  local_90._8_8_ = 0;
  local_80._M_local_buf[0] = '\0';
  local_70.super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  VStack_58.bigint = 0;
  VStack_58.hugeint.upper = 0;
  pPStack_48 = (pointer)0x0;
  local_b8 = (undefined1  [8])((ulong)local_b8 & 0xffffffffffffff00);
  local_90._M_allocated_capacity = (size_type)&local_80;
  ::std::__cxx11::string::_M_assign((string *)&_Stack_b0);
  ::std::__cxx11::string::_M_assign((string *)local_90._M_local_buf);
  ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::operator=
            (&local_70,
             (vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> *)
             &local_38._M_pi[0xc]._M_use_count);
  ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::operator=
            ((vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> *)
             &VStack_58.hugeint,
             (vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> *)
             (local_38._M_pi + 0xe));
  pCVar9 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_100);
  make_uniq<duckdb::ForeignKeyConstraint,duckdb::vector<std::__cxx11::string,true>&,duckdb::vector<std::__cxx11::string,true>&,duckdb::ForeignKeyInfo>
            ((duckdb *)&local_108,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)&local_38._M_pi[9]._M_use_count,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)(local_38._M_pi + 0xb),(ForeignKeyInfo *)local_b8);
  local_f8._0_8_ = local_108._M_head_impl;
  local_108._M_head_impl = (BoundCreateTableInfo *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
              *)&pCVar9->constraints,
             (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
             local_f8);
  if ((_Tuple_impl<0UL,_duckdb::Constraint_*,_std::default_delete<duckdb::Constraint>_>)
      local_f8._0_8_ != (Constraint *)0x0) {
    (**(code **)(*(long *)local_f8._0_8_ + 8))();
  }
  local_f8._0_8_ = (Constraint *)0x0;
  if (local_108._M_head_impl != (BoundCreateTableInfo *)0x0) {
    (*(code *)((local_108._M_head_impl)->schema->super_InCatalogEntry).super_CatalogEntry.oid)();
  }
  _Var6._M_head_impl = local_100._M_head_impl;
  local_108._M_head_impl = (BoundCreateTableInfo *)0x0;
  if (local_c0.ptr == (ClientContext *)0x0) {
    local_100._M_head_impl = (CreateTableInfo *)0x0;
    local_d8._8_8_ = _Var6._M_head_impl;
    Binder::BindCreateTableCheckpoint
              ((Binder *)local_f8,
               (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
               (local_d8 + 8),
               *(SchemaCatalogEntry **)&((context.ptr)->config).query_verification_enabled);
    uVar7 = local_f8._0_8_;
    _Var5._M_head_impl = local_108._M_head_impl;
    local_f8._0_8_ = (Constraint *)0x0;
    local_108._M_head_impl = (BoundCreateTableInfo *)uVar7;
    if (_Var5._M_head_impl != (BoundCreateTableInfo *)0x0) {
      ::std::default_delete<duckdb::BoundCreateTableInfo>::operator()
                ((default_delete<duckdb::BoundCreateTableInfo> *)&local_108,_Var5._M_head_impl);
    }
    if ((_Tuple_impl<0UL,_duckdb::Constraint_*,_std::default_delete<duckdb::Constraint>_>)
        local_f8._0_8_ != (Constraint *)0x0) {
      ::std::default_delete<duckdb::BoundCreateTableInfo>::operator()
                ((default_delete<duckdb::BoundCreateTableInfo> *)local_f8,
                 (BoundCreateTableInfo *)local_f8._0_8_);
    }
    local_f8._0_8_ =
         (_Tuple_impl<0UL,_duckdb::Constraint_*,_std::default_delete<duckdb::Constraint>_>)0x0;
    if ((CreateTableInfo *)local_d8._8_8_ != (CreateTableInfo *)0x0) {
      (*(((CreateInfo *)local_d8._8_8_)->super_ParseInfo)._vptr_ParseInfo[1])();
    }
    local_d8._8_8_ = (_Hash_node_base *)0x0;
  }
  else {
    optional_ptr<duckdb::ClientContext,_true>::CheckValid(&local_c0);
    Binder::CreateBinder
              ((Binder *)local_f8,local_c0.ptr,(optional_ptr<duckdb::Binder,_true>)0x0,
               REGULAR_BINDER);
    info_00 = shared_ptr<duckdb::Binder,_true>::operator->
                        ((shared_ptr<duckdb::Binder,_true> *)local_f8);
    local_d8._16_8_ = local_100._M_head_impl;
    local_100._M_head_impl = (CreateTableInfo *)0x0;
    Binder::BindCreateTableInfo
              ((Binder *)local_d8,
               (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
               info_00,(SchemaCatalogEntry *)(local_d8 + 0x10));
    uVar7 = local_d8._0_8_;
    _Var5._M_head_impl = local_108._M_head_impl;
    local_d8._0_8_ = (element_type *)0x0;
    local_108._M_head_impl = (BoundCreateTableInfo *)uVar7;
    if (_Var5._M_head_impl != (BoundCreateTableInfo *)0x0) {
      ::std::default_delete<duckdb::BoundCreateTableInfo>::operator()
                ((default_delete<duckdb::BoundCreateTableInfo> *)&local_108,_Var5._M_head_impl);
    }
    if ((element_type *)local_d8._0_8_ != (element_type *)0x0) {
      ::std::default_delete<duckdb::BoundCreateTableInfo>::operator()
                ((default_delete<duckdb::BoundCreateTableInfo> *)local_d8,
                 (BoundCreateTableInfo *)local_d8._0_8_);
    }
    local_d8._0_8_ = (element_type *)0x0;
    if ((ClientContext *)local_d8._16_8_ != (ClientContext *)0x0) {
      (*(((CreateInfo *)local_d8._16_8_)->super_ParseInfo)._vptr_ParseInfo[1])();
    }
    local_d8._16_8_ = (ClientContext *)0x0;
    if ((pointer)local_f8._8_8_ != (pointer)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
    }
  }
  catalog = (Catalog *)((context.ptr)->config).max_expression_depth;
  pSVar3 = *(SchemaCatalogEntry **)&((context.ptr)->config).query_verification_enabled;
  info_01 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
            ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                         *)&local_108);
  this_03 = (DuckTableEntry *)operator_new(0x298);
  local_f8._0_8_ = ((context.ptr)->config).user_variables._M_h._M_bucket_count;
  local_f8._8_8_ = ((context.ptr)->config).user_variables._M_h._M_before_begin._M_nxt;
  if ((pointer)local_f8._8_8_ != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      psVar1 = &(((pointer)local_f8._8_8_)->name)._M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
      UNLOCK();
    }
    else {
      psVar1 = &(((pointer)local_f8._8_8_)->name)._M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
    }
  }
  DuckTableEntry(this_03,catalog,pSVar3,info_01,(shared_ptr<duckdb::DataTable,_true> *)local_f8);
  if ((pointer)local_f8._8_8_ != (pointer)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
  }
  _Var8._M_head_impl = local_40._M_head_impl;
  (local_40._M_head_impl)->_vptr_CatalogEntry = (_func_int **)this_03;
  if (local_108._M_head_impl != (BoundCreateTableInfo *)0x0) {
    ::std::default_delete<duckdb::BoundCreateTableInfo>::operator()
              ((default_delete<duckdb::BoundCreateTableInfo> *)&local_108,local_108._M_head_impl);
  }
  if (VStack_58._0_8_ != (pointer)0x0) {
    operator_delete((void *)VStack_58.bigint);
  }
  if ((__node_base_ptr)
      local_70.super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
      _M_impl.super__Vector_impl_data._M_start != (__node_base_ptr)0x0) {
    operator_delete(local_70.
                    super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_allocated_capacity != &local_80) {
    operator_delete((void *)local_90._M_allocated_capacity);
  }
  if ((pointer)_Stack_b0._M_nxt != (pointer)(local_a8 + 8)) {
    operator_delete(_Stack_b0._M_nxt);
  }
  if (local_100._M_head_impl != (CreateTableInfo *)0x0) {
    (*((local_100._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
  }
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         _Var8._M_head_impl;
}

Assistant:

unique_ptr<CatalogEntry> DuckTableEntry::AddForeignKeyConstraint(optional_ptr<ClientContext> context,
                                                                 AlterForeignKeyInfo &info) {
	D_ASSERT(info.type == AlterForeignKeyType::AFT_ADD);
	auto create_info = make_uniq<CreateTableInfo>(schema, name);
	create_info->temporary = temporary;
	create_info->comment = comment;
	create_info->tags = tags;

	create_info->columns = columns.Copy();
	for (idx_t i = 0; i < constraints.size(); i++) {
		create_info->constraints.push_back(constraints[i]->Copy());
	}
	ForeignKeyInfo fk_info;
	fk_info.type = ForeignKeyType::FK_TYPE_PRIMARY_KEY_TABLE;
	fk_info.schema = info.schema;
	fk_info.table = info.fk_table;
	fk_info.pk_keys = info.pk_keys;
	fk_info.fk_keys = info.fk_keys;
	create_info->constraints.push_back(
	    make_uniq<ForeignKeyConstraint>(info.pk_columns, info.fk_columns, std::move(fk_info)));

	unique_ptr<BoundCreateTableInfo> bound_create_info;
	if (context) {
		auto binder = Binder::CreateBinder(*context);
		bound_create_info = binder->BindCreateTableInfo(std::move(create_info), schema);
	} else {
		bound_create_info = Binder::BindCreateTableCheckpoint(std::move(create_info), schema);
	}
	return make_uniq<DuckTableEntry>(catalog, schema, *bound_create_info, storage);
}